

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O2

string * __thiscall
cmFindPathCommand::FindNormalHeader_abi_cxx11_
          (string *__return_storage_ptr__,cmFindPathCommand *this)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  string *psVar4;
  pointer pbVar5;
  pointer pbVar6;
  string tryPath;
  allocator<char> local_59;
  string *local_58;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pbVar6 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = __return_storage_ptr__;
  do {
    psVar4 = local_58;
    if (pbVar6 == pbVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"",&local_59);
LAB_002563e0:
      std::__cxx11::string::~string((string *)&local_50);
      return psVar4;
    }
    pbVar2 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar5 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1)
    {
      std::__cxx11::string::_M_assign((string *)&local_50);
      std::__cxx11::string::append((string *)&local_50);
      bVar3 = cmsys::SystemTools::FileExists(&local_50);
      psVar4 = local_58;
      if (bVar3) {
        if ((this->super_cmFindBase).field_0x222 == '\x01') {
          (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p == &local_50.field_2) {
            (local_58->field_2)._M_allocated_capacity =
                 CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                          local_50.field_2._M_local_buf[0]);
            *(undefined8 *)((long)&local_58->field_2 + 8) = local_50.field_2._8_8_;
          }
          else {
            (local_58->_M_dataplus)._M_p = local_50._M_dataplus._M_p;
            (local_58->field_2)._M_allocated_capacity =
                 CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                          local_50.field_2._M_local_buf[0]);
          }
          local_58->_M_string_length = local_50._M_string_length;
          local_50._M_string_length = 0;
          local_50.field_2._M_local_buf[0] = '\0';
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        }
        else {
          std::__cxx11::string::string((string *)local_58,(string *)pbVar5);
        }
        goto LAB_002563e0;
      }
    }
    pbVar6 = pbVar6 + 1;
  } while( true );
}

Assistant:

std::string cmFindPathCommand::FindNormalHeader()
{
  std::string tryPath;
  for (std::string const& n : this->Names) {
    for (std::string const& sp : this->SearchPaths) {
      tryPath = sp;
      tryPath += n;
      if (cmSystemTools::FileExists(tryPath)) {
        if (this->IncludeFileInPath) {
          return tryPath;
        }
        return sp;
      }
    }
  }
  return "";
}